

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoPartitionPartialsOperations
          (BeagleCPUImpl<float,_1,_0> *this,int *operations,int *partitionOperations,int count,
          int cumulativeScaleIndex)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int k;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (0 < count) {
    iVar4 = this->kPartitionCount;
    uVar2 = 0;
    do {
      if (0 < iVar4) {
        iVar3 = 0;
        do {
          lVar5 = 0;
          do {
            piVar1 = operations + lVar5;
            iVar4 = (int)uVar2;
            lVar6 = (this->kPartitionCount * iVar4 + iVar3) * 9 + lVar5;
            lVar5 = lVar5 + 1;
            partitionOperations[lVar6] = *piVar1;
          } while (lVar5 != 7);
          partitionOperations[(long)((this->kPartitionCount * iVar4 + iVar3) * 9) + 7] = iVar3;
          iVar4 = this->kPartitionCount * iVar4 + iVar3;
          iVar3 = iVar3 + 1;
          partitionOperations[(long)(iVar4 * 9) + 8] = cumulativeScaleIndex;
          iVar4 = this->kPartitionCount;
        } while (iVar3 < iVar4);
      }
      uVar2 = uVar2 + 1;
      operations = operations + 7;
    } while (uVar2 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoPartitionPartialsOperations(const int* operations,
                                                                        int* partitionOperations,
                                                                        int count,
                                                                        int cumulativeScaleIndex) {

    int numOps  = BEAGLE_OP_COUNT;
    int numOpsP = BEAGLE_PARTITION_OP_COUNT;

    for (int i=0; i<count; i++) {
        for (int j=0; j<kPartitionCount; j++) {
            for (int k=0; k<numOps; k++) {
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + k] = operations[i*numOps + k];
            }
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps    ] = j;
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps + 1] = cumulativeScaleIndex;
        }
    }
}